

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O1

void TR_Stmt(ast *node)

{
  int iVar1;
  ast *paVar2;
  Operand label3;
  Operand label2;
  Operand label1;
  Operand t1;
  undefined1 local_220 [8];
  _Alloc_hider local_218;
  _Alloc_hider local_210;
  char local_208 [8];
  char local_200 [32];
  _Alloc_hider local_1e0;
  char local_1d0 [32];
  _Alloc_hider local_1b0;
  char local_1a0 [24];
  undefined1 local_188 [8];
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  int local_160;
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  int local_130;
  undefined1 local_128 [8];
  _Alloc_hider local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  int local_100;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  int local_d0;
  InterCode local_c8;
  
  paVar2 = child(node,1);
  local_120._M_p = (pointer)&local_110;
  local_128._0_4_ = 0;
  local_118 = 0;
  local_110._M_local_buf[0] = '\0';
  local_100 = -1;
  local_150._M_p = (pointer)&local_140;
  local_158._0_4_ = 0;
  local_148 = 0;
  local_140._M_local_buf[0] = '\0';
  local_130 = -1;
  local_180._M_p = (pointer)&local_170;
  local_188._0_4_ = 0;
  local_178 = 0;
  local_170._M_local_buf[0] = '\0';
  local_160 = -1;
  local_f8._0_4_ = 0;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_d0 = -1;
  iVar1 = paVar2->type;
  local_f0._M_p = (pointer)&local_e0;
  if (iVar1 < 0x118) {
    if (iVar1 == -0x2704) {
      TR_CompSt(paVar2);
    }
    else {
      if (iVar1 != -0x26fd) {
LAB_0010e868:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                      ,0x2b3,"void TR_Stmt(ast *)");
      }
      TR_Exp(paVar2,&OP_NONE);
    }
    goto LAB_0010e7f6;
  }
  if (iVar1 == 0x118) {
    IrSim::newTmpVar((Operand *)local_220,&irSim);
    local_f8._0_4_ = local_220._0_4_;
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_218);
    local_d0._0_1_ = local_200[8];
    local_d0._1_1_ = local_200[9];
    local_d0._2_1_ = local_200[10];
    local_d0._3_1_ = local_200[0xb];
    if (local_218._M_p != local_208) {
      operator_delete(local_218._M_p);
    }
    paVar2 = child(node,2);
    TR_Exp(paVar2,(C_OP *)local_f8);
    IrSim::icNoOp((InterCode *)local_220,&irSim,0xb,(C_OP *)local_f8);
    IrSim::commitIc(&irSim,(C_IC *)local_220);
    if (local_1b0._M_p != local_1a0) {
      operator_delete(local_1b0._M_p);
    }
    if (local_1e0._M_p != local_1d0) {
      operator_delete(local_1e0._M_p);
    }
    if (local_210._M_p == local_200) goto LAB_0010e7f6;
  }
  else {
    if (iVar1 == 0x119) {
      IrSim::newLabel((Operand *)local_220,&irSim);
      local_128._0_4_ = local_220._0_4_;
      std::__cxx11::string::operator=((string *)&local_120,(string *)&local_218);
      local_100._0_1_ = local_200[8];
      local_100._1_1_ = local_200[9];
      local_100._2_1_ = local_200[10];
      local_100._3_1_ = local_200[0xb];
      if (local_218._M_p != local_208) {
        operator_delete(local_218._M_p);
      }
      IrSim::newLabel((Operand *)local_220,&irSim);
      local_158._0_4_ = local_220._0_4_;
      std::__cxx11::string::operator=((string *)&local_150,(string *)&local_218);
      local_130._0_1_ = local_200[8];
      local_130._1_1_ = local_200[9];
      local_130._2_1_ = local_200[10];
      local_130._3_1_ = local_200[0xb];
      if (local_218._M_p != local_208) {
        operator_delete(local_218._M_p);
      }
      paVar2 = child(node,3);
      TR_Cond(paVar2,(C_OP *)local_128,(C_OP *)local_158);
      IrSim::icNoOp((InterCode *)local_220,&irSim,0x10,(C_OP *)local_128);
      IrSim::commitIc(&irSim,(C_IC *)local_220);
      if (local_1b0._M_p != local_1a0) {
        operator_delete(local_1b0._M_p);
      }
      if (local_1e0._M_p != local_1d0) {
        operator_delete(local_1e0._M_p);
      }
      if (local_210._M_p != local_200) {
        operator_delete(local_210._M_p);
      }
      paVar2 = child(node,5);
      TR_Stmt(paVar2);
      paVar2 = child(node,7);
      if (paVar2 == (ast *)0x0) {
        IrSim::icNoOp((InterCode *)local_220,&irSim,0x10,(C_OP *)local_158);
        IrSim::commitIc(&irSim,(C_IC *)local_220);
      }
      else {
        IrSim::newLabel((Operand *)local_220,&irSim);
        local_188._0_4_ = local_220._0_4_;
        std::__cxx11::string::operator=((string *)&local_180,(string *)&local_218);
        local_160._0_1_ = local_200[8];
        local_160._1_1_ = local_200[9];
        local_160._2_1_ = local_200[10];
        local_160._3_1_ = local_200[0xb];
        if (local_218._M_p != local_208) {
          operator_delete(local_218._M_p);
        }
        IrSim::icNoOp((InterCode *)local_220,&irSim,0xe,(C_OP *)local_188);
        IrSim::commitIc(&irSim,(C_IC *)local_220);
        IrSim::icNoOp(&local_c8,&irSim,0x10,(C_OP *)local_158);
        IrSim::commitIc(&irSim,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.arg2.value._M_dataplus._M_p != &local_c8.arg2.value.field_2) {
          operator_delete(local_c8.arg2.value._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.arg1.value._M_dataplus._M_p != &local_c8.arg1.value.field_2) {
          operator_delete(local_c8.arg1.value._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.target.value._M_dataplus._M_p != &local_c8.target.value.field_2) {
          operator_delete(local_c8.target.value._M_dataplus._M_p);
        }
        if (local_1b0._M_p != local_1a0) {
          operator_delete(local_1b0._M_p);
        }
        if (local_1e0._M_p != local_1d0) {
          operator_delete(local_1e0._M_p);
        }
        if (local_210._M_p != local_200) {
          operator_delete(local_210._M_p);
        }
        TR_Stmt(paVar2);
        IrSim::icNoOp((InterCode *)local_220,&irSim,0x10,(C_OP *)local_188);
        IrSim::commitIc(&irSim,(C_IC *)local_220);
      }
      if (local_1b0._M_p != local_1a0) {
        operator_delete(local_1b0._M_p);
      }
      if (local_1e0._M_p != local_1d0) {
LAB_0010e7e2:
        operator_delete(local_1e0._M_p);
      }
    }
    else {
      if (iVar1 != 0x11b) goto LAB_0010e868;
      IrSim::newLabel((Operand *)local_220,&irSim);
      local_128._0_4_ = local_220._0_4_;
      std::__cxx11::string::operator=((string *)&local_120,(string *)&local_218);
      local_100._0_1_ = local_200[8];
      local_100._1_1_ = local_200[9];
      local_100._2_1_ = local_200[10];
      local_100._3_1_ = local_200[0xb];
      if (local_218._M_p != local_208) {
        operator_delete(local_218._M_p);
      }
      IrSim::newLabel((Operand *)local_220,&irSim);
      local_158._0_4_ = local_220._0_4_;
      std::__cxx11::string::operator=((string *)&local_150,(string *)&local_218);
      local_130._0_1_ = local_200[8];
      local_130._1_1_ = local_200[9];
      local_130._2_1_ = local_200[10];
      local_130._3_1_ = local_200[0xb];
      if (local_218._M_p != local_208) {
        operator_delete(local_218._M_p);
      }
      IrSim::newLabel((Operand *)local_220,&irSim);
      local_188._0_4_ = local_220._0_4_;
      std::__cxx11::string::operator=((string *)&local_180,(string *)&local_218);
      local_160._0_1_ = local_200[8];
      local_160._1_1_ = local_200[9];
      local_160._2_1_ = local_200[10];
      local_160._3_1_ = local_200[0xb];
      if (local_218._M_p != local_208) {
        operator_delete(local_218._M_p);
      }
      IrSim::icNoOp((InterCode *)local_220,&irSim,0x10,(C_OP *)local_128);
      IrSim::commitIc(&irSim,(C_IC *)local_220);
      if (local_1b0._M_p != local_1a0) {
        operator_delete(local_1b0._M_p);
      }
      if (local_1e0._M_p != local_1d0) {
        operator_delete(local_1e0._M_p);
      }
      if (local_210._M_p != local_200) {
        operator_delete(local_210._M_p);
      }
      paVar2 = child(node,3);
      TR_Cond(paVar2,(C_OP *)local_158,(C_OP *)local_188);
      IrSim::icNoOp((InterCode *)local_220,&irSim,0x10,(C_OP *)local_158);
      IrSim::commitIc(&irSim,(C_IC *)local_220);
      if (local_1b0._M_p != local_1a0) {
        operator_delete(local_1b0._M_p);
      }
      if (local_1e0._M_p != local_1d0) {
        operator_delete(local_1e0._M_p);
      }
      if (local_210._M_p != local_200) {
        operator_delete(local_210._M_p);
      }
      paVar2 = child(node,5);
      TR_Stmt(paVar2);
      IrSim::icNoOp((InterCode *)local_220,&irSim,0xe,(C_OP *)local_128);
      IrSim::commitIc(&irSim,(C_IC *)local_220);
      IrSim::icNoOp(&local_c8,&irSim,0x10,(C_OP *)local_188);
      IrSim::commitIc(&irSim,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.arg2.value._M_dataplus._M_p != &local_c8.arg2.value.field_2) {
        operator_delete(local_c8.arg2.value._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.arg1.value._M_dataplus._M_p != &local_c8.arg1.value.field_2) {
        operator_delete(local_c8.arg1.value._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.target.value._M_dataplus._M_p != &local_c8.target.value.field_2) {
        operator_delete(local_c8.target.value._M_dataplus._M_p);
      }
      if (local_1b0._M_p != local_1a0) {
        operator_delete(local_1b0._M_p);
      }
      if (local_1e0._M_p != local_1d0) goto LAB_0010e7e2;
    }
    if (local_210._M_p == local_200) goto LAB_0010e7f6;
  }
  operator_delete(local_210._M_p);
LAB_0010e7f6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &local_170) {
    operator_delete(local_180._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_p != &local_140) {
    operator_delete(local_150._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_p != &local_110) {
    operator_delete(local_120._M_p);
  }
  return;
}

Assistant:

static void TR_Stmt(ast *node) {
    ast *c1 = child(node, 1), *c7;
    Operand label1, label2, label3, t1;
    switch (c1->type) {
        case Exp:    TR_Exp(c1, OP_NONE); break;
        case CompSt: TR_CompSt(c1);       break;
        case RETURN:
            t1 = irSim.newTmpVar();
            TR_Exp(child(node, 2), t1);
            irSim << irSim.icReturn(t1);
            break;
        case IF:
            label1 = irSim.newLabel();
            label2 = irSim.newLabel();
            TR_Cond(child(node, 3), label1, label2);
            irSim << irSim.icLabel(label1);
            TR_Stmt(child(node, 5));
            if (!(c7 = child(node, 7))) { // without ELSE node
                irSim << irSim.icLabel(label2);
                return;
            }
            label3 = irSim.newLabel();
            irSim << irSim.icGoto(label3) << irSim.icLabel(label2);
            TR_Stmt(c7);
            irSim << irSim.icLabel(label3);
            break;
        case WHILE:
            label1 = irSim.newLabel();
            label2 = irSim.newLabel();
            label3 = irSim.newLabel();
            irSim << irSim.icLabel(label1);
            TR_Cond(child(node, 3), label2, label3);
            irSim << irSim.icLabel(label2);
            TR_Stmt(child(node, 5));
            irSim << irSim.icGoto(label1) << irSim.icLabel(label3);
            break;
        default: assert(false); break;
    }
}